

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint32 Hash32Len0to4(char *s,size_t len)

{
  uint32 uVar1;
  ulong uStack_28;
  char v;
  size_t i;
  uint32 c;
  uint32 b;
  size_t len_local;
  char *s_local;
  
  i._4_4_ = 0;
  i._0_4_ = 9;
  for (uStack_28 = 0; uStack_28 < len; uStack_28 = uStack_28 + 1) {
    i._4_4_ = i._4_4_ * -0x3361d2af + (int)s[uStack_28];
    i._0_4_ = i._4_4_ ^ (uint)i;
  }
  uVar1 = Mur((uint32)len,(uint)i);
  uVar1 = Mur(i._4_4_,uVar1);
  uVar1 = fmix(uVar1);
  return uVar1;
}

Assistant:

static uint32 Hash32Len0to4(const char *s, size_t len) {
  uint32 b = 0;
  uint32 c = 9;
  for (size_t i = 0; i < len; i++) {
    signed char v = s[i];
    b = b * c1 + v;
    c ^= b;
  }
  return fmix(Mur(b, Mur(len, c)));
}